

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_vdpu1.c
# Opt level: O3

MPP_RET hal_avsd_vdpu1_deinit(void *decoder)

{
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_vdpu1","In.","hal_avsd_vdpu1_deinit");
  }
  if (*(MppBuffer *)((long)decoder + 0x1b0) != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)decoder + 0x1b0),"hal_avsd_vdpu1_deinit");
    *(undefined8 *)((long)decoder + 0x1b0) = 0;
  }
  if (*(void **)((long)decoder + 0x1a0) != (void *)0x0) {
    mpp_osal_free("hal_avsd_vdpu1_deinit",*(void **)((long)decoder + 0x1a0));
  }
  *(undefined8 *)((long)decoder + 0x1a0) = 0;
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_vdpu1","Out.","hal_avsd_vdpu1_deinit");
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_avsd_vdpu1_deinit(void *decoder)
{
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");

    if (p_hal->mv_buf) {
        mpp_buffer_put(p_hal->mv_buf);
        p_hal->mv_buf = NULL;
    }
    MPP_FREE(p_hal->p_regs);

    AVSD_HAL_TRACE("Out.");

    return MPP_OK;
}